

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt_avx2.c
# Opt level: O0

void av1_get_horver_correlation_full_avx2
               (int16_t *diff,int stride,int width,int height,float *hcorr,float *vcorr)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  float fVar5;
  float fVar6;
  __m256i v;
  __m256i v_00;
  int in_ECX;
  int in_EDX;
  int iVar7;
  int in_ESI;
  long in_RDI;
  float *in_R8;
  float *in_R9;
  float fVar8;
  float fVar9;
  float fVar10;
  float xz_var_n;
  float xy_var_n;
  float z_var_n;
  float y_var_n;
  float xver_var_n;
  float xhor_var_n;
  float num_ver;
  float num_hor;
  int64_t z2_sum;
  int64_t y2_sum;
  int64_t x2ver_sum;
  int64_t x2hor_sum;
  int64_t z_sum;
  int64_t y_sum;
  int64_t xver_sum;
  int64_t xhor_sum;
  int i_3;
  int j_3;
  int64_t x2_firstcol;
  int64_t x2_firstrow;
  int64_t x_firstcol;
  int64_t x_firstrow;
  int16_t w_1;
  int16_t z_2;
  int16_t y_2;
  int16_t x_3;
  int i_2;
  int16_t y0;
  int16_t x0_3;
  int16_t z_1;
  int16_t x_2;
  int i_1;
  int16_t x0_2;
  int16_t w;
  int16_t z;
  int16_t y_1;
  int16_t x_1;
  int j_2;
  int16_t z0;
  int16_t x0_1;
  int16_t y;
  int16_t x;
  int j_1;
  int16_t x0;
  int64_t x2_finalcol;
  int64_t x2_finalrow;
  int64_t x_finalcol;
  int64_t x_finalrow;
  __m256i hadd_x_x2;
  __m256i hadd_xy_xz;
  int j;
  int i;
  __m256i x2_sum_32;
  __m256i x_sum_32;
  __m256i xz_sum_32;
  __m256i xy_sum_32;
  int32_t x_x2_tmp [8];
  int32_t xy_xz_tmp [8];
  int64_t x2_sum;
  int64_t x_sum;
  int64_t xz_sum;
  int64_t xy_sum;
  undefined8 in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbcc;
  undefined4 in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd4;
  undefined4 in_stack_fffffffffffffbf0;
  float fVar11;
  undefined4 in_stack_fffffffffffffbf4;
  int local_3c0;
  int local_3bc;
  long local_3b8;
  long local_3b0;
  long local_3a8;
  long local_3a0;
  int local_390;
  int local_384;
  int local_374;
  int local_368;
  long local_360;
  long local_358;
  long local_350;
  long local_348;
  undefined1 in_stack_fffffffffffffcc0 [32];
  undefined1 in_stack_fffffffffffffce0 [32];
  int local_2e8;
  int local_2e4;
  long local_208;
  long local_200;
  long local_1f8;
  long local_1f0;
  
  local_1f0 = 0;
  local_1f8 = 0;
  for (local_2e4 = 0; local_2e4 <= in_ECX + -4; local_2e4 = local_2e4 + 3) {
    for (local_2e8 = 0; local_2e8 <= in_EDX + -4; local_2e8 = local_2e8 + 3) {
      horver_correlation_4x4
                (in_stack_fffffffffffffce0._16_8_,in_stack_fffffffffffffce0._12_4_,
                 in_stack_fffffffffffffce0._0_8_,in_stack_fffffffffffffcc0._24_8_,
                 in_stack_fffffffffffffcc0._16_8_,in_stack_fffffffffffffcc0._8_8_);
    }
    in_stack_fffffffffffffce0 = vphaddd_avx2(ZEXT832(0) << 0x40,ZEXT832(0) << 0x40);
    v[1] = in_stack_fffffffffffffbc0;
    v[0] = 0xab2858;
    v[2]._0_4_ = in_stack_fffffffffffffbc8;
    v[2]._4_4_ = in_stack_fffffffffffffbcc;
    v[3]._0_4_ = in_stack_fffffffffffffbd0;
    v[3]._4_4_ = in_stack_fffffffffffffbd4;
    yy_storeu_256((void *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),v);
    in_stack_fffffffffffffcc0 = vphaddd_avx2(ZEXT832(0) << 0x40,ZEXT832(0) << 0x40);
    v_00[1] = in_stack_fffffffffffffbc0;
    v_00[0] = 0xab2914;
    v_00[2]._0_4_ = in_stack_fffffffffffffbc8;
    v_00[2]._4_4_ = in_stack_fffffffffffffbcc;
    v_00[3]._0_4_ = in_stack_fffffffffffffbd0;
    v_00[3]._4_4_ = in_stack_fffffffffffffbd4;
    yy_storeu_256((void *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),v_00);
  }
  if (in_ECX % 3 == 1) {
    sVar1 = *(short *)(in_RDI + (long)((in_ECX + -1) * in_ESI) * 2);
    local_200 = (long)sVar1;
    local_348 = (long)sVar1;
    local_208 = (long)((int)sVar1 * (int)sVar1);
    local_358 = (long)((int)sVar1 * (int)sVar1);
    for (local_368 = 0; local_368 < in_EDX + -1; local_368 = local_368 + 1) {
      sVar1 = *(short *)(in_RDI + (long)((in_ECX + -1) * in_ESI + local_368 + 1) * 2);
      local_1f0 = (int)*(short *)(in_RDI + (long)((in_ECX + -1) * in_ESI + local_368) * 2) *
                  (int)sVar1 + local_1f0;
      local_200 = sVar1 + local_200;
      local_208 = (int)sVar1 * (int)sVar1 + local_208;
      local_348 = sVar1 + local_348;
      local_358 = (int)sVar1 * (int)sVar1 + local_358;
    }
  }
  else {
    sVar1 = *(short *)(in_RDI + (long)((in_ECX + -2) * in_ESI) * 2);
    sVar2 = *(short *)(in_RDI + (long)((in_ECX + -1) * in_ESI) * 2);
    local_200 = (long)((int)sVar1 + (int)sVar2);
    local_208 = (long)((int)sVar1 * (int)sVar1 + (int)sVar2 * (int)sVar2);
    local_348 = (long)sVar2;
    local_358 = (long)((int)sVar2 * (int)sVar2);
    for (local_374 = 0; local_374 < in_EDX + -1; local_374 = local_374 + 1) {
      sVar1 = *(short *)(in_RDI + (long)((in_ECX + -2) * in_ESI + local_374) * 2);
      sVar2 = *(short *)(in_RDI + (long)((in_ECX + -2) * in_ESI + local_374 + 1) * 2);
      sVar3 = *(short *)(in_RDI + (long)((in_ECX + -1) * in_ESI + local_374) * 2);
      sVar4 = *(short *)(in_RDI + (long)((in_ECX + -1) * in_ESI + local_374 + 1) * 2);
      local_1f8 = (int)sVar1 * (int)sVar3 + local_1f8;
      local_1f0 = (long)((int)sVar3 * (int)sVar4) + (int)sVar1 * (int)sVar2 + local_1f0;
      local_200 = ((int)sVar2 + (int)sVar4) + local_200;
      local_208 = ((int)sVar2 * (int)sVar2 + (int)sVar4 * (int)sVar4) + local_208;
      local_348 = sVar4 + local_348;
      local_358 = (int)sVar4 * (int)sVar4 + local_358;
    }
  }
  if (in_EDX % 3 == 1) {
    sVar1 = *(short *)(in_RDI + (long)(in_EDX + -1) * 2);
    local_200 = sVar1 + local_200;
    local_350 = (long)sVar1;
    local_208 = (int)sVar1 * (int)sVar1 + local_208;
    local_360 = (long)((int)sVar1 * (int)sVar1);
    for (local_384 = 0; local_384 < in_ECX + -1; local_384 = local_384 + 1) {
      sVar1 = *(short *)(in_RDI + (long)((local_384 + 1) * in_ESI + in_EDX + -1) * 2);
      local_1f8 = (int)*(short *)(in_RDI + (long)(local_384 * in_ESI + in_EDX + -1) * 2) *
                  (int)sVar1 + local_1f8;
      local_350 = sVar1 + local_350;
      local_360 = (int)sVar1 * (int)sVar1 + local_360;
      iVar7 = 3;
      if (in_ECX % 3 == 1) {
        iVar7 = 2;
      }
      if (local_384 < in_ECX - iVar7) {
        local_200 = sVar1 + local_200;
        local_208 = (int)sVar1 * (int)sVar1 + local_208;
      }
    }
  }
  else {
    sVar1 = *(short *)(in_RDI + (long)(in_EDX + -2) * 2);
    sVar2 = *(short *)(in_RDI + (long)(in_EDX + -1) * 2);
    local_200 = ((int)sVar1 + (int)sVar2) + local_200;
    local_208 = ((int)sVar1 * (int)sVar1 + (int)sVar2 * (int)sVar2) + local_208;
    local_350 = (long)sVar2;
    local_360 = (long)((int)sVar2 * (int)sVar2);
    for (local_390 = 0; local_390 < in_ECX + -1; local_390 = local_390 + 1) {
      sVar1 = *(short *)(in_RDI + (long)(local_390 * in_ESI + in_EDX + -2) * 2);
      sVar2 = *(short *)(in_RDI + (long)(local_390 * in_ESI + in_EDX + -1) * 2);
      sVar3 = *(short *)(in_RDI + (long)((local_390 + 1) * in_ESI + in_EDX + -2) * 2);
      sVar4 = *(short *)(in_RDI + (long)((local_390 + 1) * in_ESI + in_EDX + -1) * 2);
      if ((local_390 < in_ECX + -2) || (in_ECX % 3 == 1)) {
        local_1f0 = (int)sVar1 * (int)sVar2 + local_1f0;
        local_1f8 = (int)sVar1 * (int)sVar3 + local_1f8;
      }
      local_350 = sVar4 + local_350;
      local_360 = (int)sVar4 * (int)sVar4 + local_360;
      iVar7 = 3;
      if (in_ECX % 3 == 1) {
        iVar7 = 2;
      }
      if (local_390 < in_ECX - iVar7) {
        local_200 = ((int)sVar3 + (int)sVar4) + local_200;
        local_208 = ((int)sVar3 * (int)sVar3 + (int)sVar4 * (int)sVar4) + local_208;
      }
      local_1f8 = (int)sVar2 * (int)sVar4 + local_1f8;
    }
  }
  local_3a0 = 0;
  local_3a8 = 0;
  local_3b0 = 0;
  local_3b8 = 0;
  for (local_3bc = 0; local_3bc < in_EDX; local_3bc = local_3bc + 1) {
    local_3a0 = *(short *)(in_RDI + (long)local_3bc * 2) + local_3a0;
    local_3b0 = (int)*(short *)(in_RDI + (long)local_3bc * 2) *
                (int)*(short *)(in_RDI + (long)local_3bc * 2) + local_3b0;
  }
  for (local_3c0 = 0; local_3c0 < in_ECX; local_3c0 = local_3c0 + 1) {
    local_3a8 = *(short *)(in_RDI + (long)(local_3c0 * in_ESI) * 2) + local_3a8;
    local_3b8 = (int)*(short *)(in_RDI + (long)(local_3c0 * in_ESI) * 2) *
                (int)*(short *)(in_RDI + (long)(local_3c0 * in_ESI) * 2) + local_3b8;
  }
  local_350 = local_200 - local_350;
  local_348 = local_200 - local_348;
  local_3a8 = local_200 - local_3a8;
  local_200 = local_200 - local_3a0;
  fVar8 = (float)(in_ECX * (in_EDX + -1));
  fVar9 = (float)((in_ECX + -1) * in_EDX);
  fVar10 = (float)(local_208 - local_360) - (float)(local_350 * local_350) / fVar8;
  fVar11 = (float)(local_208 - local_358) - (float)(local_348 * local_348) / fVar9;
  fVar5 = (float)(local_208 - local_3b8) - (float)(local_3a8 * local_3a8) / fVar8;
  fVar6 = (float)(local_208 - local_3b0) - (float)(local_200 * local_200) / fVar9;
  fVar8 = (float)local_1f0 - (float)(local_350 * local_3a8) / fVar8;
  fVar9 = (float)local_1f8 - (float)(local_348 * local_200) / fVar9;
  if ((fVar10 <= 0.0) || (fVar5 <= 0.0)) {
    *in_R8 = 1.0;
  }
  else {
    fVar10 = sqrtf(fVar10 * fVar5);
    *in_R8 = fVar8 / fVar10;
    if (0.0 <= *in_R8) {
      fVar10 = *in_R8;
    }
    else {
      fVar10 = 0.0;
    }
    *in_R8 = fVar10;
  }
  if ((fVar11 <= 0.0) || (fVar6 <= 0.0)) {
    *in_R9 = 1.0;
  }
  else {
    fVar10 = sqrtf(fVar11 * fVar6);
    *in_R9 = fVar9 / fVar10;
    if (0.0 <= *in_R9) {
      fVar10 = *in_R9;
    }
    else {
      fVar10 = 0.0;
    }
    *in_R9 = fVar10;
  }
  return;
}

Assistant:

void av1_get_horver_correlation_full_avx2(const int16_t *diff, int stride,
                                          int width, int height, float *hcorr,
                                          float *vcorr) {
  // The following notation is used:
  // x - current pixel
  // y - right neighbour pixel
  // z - below neighbour pixel
  // w - down-right neighbour pixel
  int64_t xy_sum = 0, xz_sum = 0;
  int64_t x_sum = 0, x2_sum = 0;

  // Process horizontal and vertical correlations through the body in 4x4
  // blocks.  This excludes the final row and column and possibly one extra
  // column depending how 3 divides into width and height
  int32_t xy_xz_tmp[8] = { 0 }, x_x2_tmp[8] = { 0 };
  __m256i xy_sum_32 = _mm256_setzero_si256();
  __m256i xz_sum_32 = _mm256_setzero_si256();
  __m256i x_sum_32 = _mm256_setzero_si256();
  __m256i x2_sum_32 = _mm256_setzero_si256();
  for (int i = 0; i <= height - 4; i += 3) {
    for (int j = 0; j <= width - 4; j += 3) {
      horver_correlation_4x4(&diff[i * stride + j], stride, &xy_sum_32,
                             &xz_sum_32, &x_sum_32, &x2_sum_32);
    }
    const __m256i hadd_xy_xz = _mm256_hadd_epi32(xy_sum_32, xz_sum_32);
    // hadd_xy_xz = [ae+bf+cg ei+fj+gk ab+bc+cd ef+fg+gh]
    //              [im+jn+ko mm+nn+oo ij+jk+kl mn+no+op] as i32
    yy_storeu_256(xy_xz_tmp, hadd_xy_xz);
    xy_sum += (int64_t)xy_xz_tmp[5] + xy_xz_tmp[4] + xy_xz_tmp[1];
    xz_sum += (int64_t)xy_xz_tmp[7] + xy_xz_tmp[6] + xy_xz_tmp[3];

    const __m256i hadd_x_x2 = _mm256_hadd_epi32(x_sum_32, x2_sum_32);
    // hadd_x_x2 = [aa+bb+cc ee+ff+gg a+b+c e+f+g]
    //             [ii+jj+kk mm+nn+oo i+j+k m+n+o] as i32
    yy_storeu_256(x_x2_tmp, hadd_x_x2);
    x_sum += (int64_t)x_x2_tmp[5] + x_x2_tmp[4] + x_x2_tmp[1];
    x2_sum += (int64_t)x_x2_tmp[7] + x_x2_tmp[6] + x_x2_tmp[3];

    xy_sum_32 = _mm256_setzero_si256();
    xz_sum_32 = _mm256_setzero_si256();
    x_sum_32 = _mm256_setzero_si256();
    x2_sum_32 = _mm256_setzero_si256();
  }

  // x_sum now covers every pixel except the final 1-2 rows and 1-2 cols
  int64_t x_finalrow = 0, x_finalcol = 0, x2_finalrow = 0, x2_finalcol = 0;

  // Do we have 2 rows remaining or just the one?  Note that width and height
  // are powers of 2, so each modulo 3 must be 1 or 2.
  if (height % 3 == 1) {  // Just horiz corrs on the final row
    const int16_t x0 = diff[(height - 1) * stride];
    x_sum += x0;
    x_finalrow += x0;
    x2_sum += x0 * x0;
    x2_finalrow += x0 * x0;
    for (int j = 0; j < width - 1; ++j) {
      const int16_t x = diff[(height - 1) * stride + j];
      const int16_t y = diff[(height - 1) * stride + j + 1];
      xy_sum += x * y;
      x_sum += y;
      x2_sum += y * y;
      x_finalrow += y;
      x2_finalrow += y * y;
    }
  } else {  // Two rows remaining to do
    const int16_t x0 = diff[(height - 2) * stride];
    const int16_t z0 = diff[(height - 1) * stride];
    x_sum += x0 + z0;
    x2_sum += x0 * x0 + z0 * z0;
    x_finalrow += z0;
    x2_finalrow += z0 * z0;
    for (int j = 0; j < width - 1; ++j) {
      const int16_t x = diff[(height - 2) * stride + j];
      const int16_t y = diff[(height - 2) * stride + j + 1];
      const int16_t z = diff[(height - 1) * stride + j];
      const int16_t w = diff[(height - 1) * stride + j + 1];

      // Horizontal and vertical correlations for the penultimate row:
      xy_sum += x * y;
      xz_sum += x * z;

      // Now just horizontal correlations for the final row:
      xy_sum += z * w;

      x_sum += y + w;
      x2_sum += y * y + w * w;
      x_finalrow += w;
      x2_finalrow += w * w;
    }
  }

  // Do we have 2 columns remaining or just the one?
  if (width % 3 == 1) {  // Just vert corrs on the final col
    const int16_t x0 = diff[width - 1];
    x_sum += x0;
    x_finalcol += x0;
    x2_sum += x0 * x0;
    x2_finalcol += x0 * x0;
    for (int i = 0; i < height - 1; ++i) {
      const int16_t x = diff[i * stride + width - 1];
      const int16_t z = diff[(i + 1) * stride + width - 1];
      xz_sum += x * z;
      x_finalcol += z;
      x2_finalcol += z * z;
      // So the bottom-right elements don't get counted twice:
      if (i < height - (height % 3 == 1 ? 2 : 3)) {
        x_sum += z;
        x2_sum += z * z;
      }
    }
  } else {  // Two cols remaining
    const int16_t x0 = diff[width - 2];
    const int16_t y0 = diff[width - 1];
    x_sum += x0 + y0;
    x2_sum += x0 * x0 + y0 * y0;
    x_finalcol += y0;
    x2_finalcol += y0 * y0;
    for (int i = 0; i < height - 1; ++i) {
      const int16_t x = diff[i * stride + width - 2];
      const int16_t y = diff[i * stride + width - 1];
      const int16_t z = diff[(i + 1) * stride + width - 2];
      const int16_t w = diff[(i + 1) * stride + width - 1];

      // Horizontal and vertical correlations for the penultimate col:
      // Skip these on the last iteration of this loop if we also had two
      // rows remaining, otherwise the final horizontal and vertical correlation
      // get erroneously processed twice
      if (i < height - 2 || height % 3 == 1) {
        xy_sum += x * y;
        xz_sum += x * z;
      }

      x_finalcol += w;
      x2_finalcol += w * w;
      // So the bottom-right elements don't get counted twice:
      if (i < height - (height % 3 == 1 ? 2 : 3)) {
        x_sum += z + w;
        x2_sum += z * z + w * w;
      }

      // Now just vertical correlations for the final column:
      xz_sum += y * w;
    }
  }

  // Calculate the simple sums and squared-sums
  int64_t x_firstrow = 0, x_firstcol = 0;
  int64_t x2_firstrow = 0, x2_firstcol = 0;

  for (int j = 0; j < width; ++j) {
    x_firstrow += diff[j];
    x2_firstrow += diff[j] * diff[j];
  }
  for (int i = 0; i < height; ++i) {
    x_firstcol += diff[i * stride];
    x2_firstcol += diff[i * stride] * diff[i * stride];
  }

  int64_t xhor_sum = x_sum - x_finalcol;
  int64_t xver_sum = x_sum - x_finalrow;
  int64_t y_sum = x_sum - x_firstcol;
  int64_t z_sum = x_sum - x_firstrow;
  int64_t x2hor_sum = x2_sum - x2_finalcol;
  int64_t x2ver_sum = x2_sum - x2_finalrow;
  int64_t y2_sum = x2_sum - x2_firstcol;
  int64_t z2_sum = x2_sum - x2_firstrow;

  const float num_hor = (float)(height * (width - 1));
  const float num_ver = (float)((height - 1) * width);

  const float xhor_var_n = x2hor_sum - (xhor_sum * xhor_sum) / num_hor;
  const float xver_var_n = x2ver_sum - (xver_sum * xver_sum) / num_ver;

  const float y_var_n = y2_sum - (y_sum * y_sum) / num_hor;
  const float z_var_n = z2_sum - (z_sum * z_sum) / num_ver;

  const float xy_var_n = xy_sum - (xhor_sum * y_sum) / num_hor;
  const float xz_var_n = xz_sum - (xver_sum * z_sum) / num_ver;

  if (xhor_var_n > 0 && y_var_n > 0) {
    *hcorr = xy_var_n / sqrtf(xhor_var_n * y_var_n);
    *hcorr = *hcorr < 0 ? 0 : *hcorr;
  } else {
    *hcorr = 1.0;
  }
  if (xver_var_n > 0 && z_var_n > 0) {
    *vcorr = xz_var_n / sqrtf(xver_var_n * z_var_n);
    *vcorr = *vcorr < 0 ? 0 : *vcorr;
  } else {
    *vcorr = 1.0;
  }
}